

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O3

string * __thiscall
JSON::JSONArray::toString_abi_cxx11_(string *__return_storage_ptr__,JSONArray *this,int indent)

{
  stringstream ss;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  if (0 < indent) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a0," ",1);
      indent = indent + -1;
    } while (indent != 0);
  }
  operator<<(local_1a0,this);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

string JSONArray::toString(int indent) const {
	stringstream ss;
	for(int i=0;i<indent;i++)
		ss << " ";
	ss << (*this);
	return ss.str();
}